

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_compression.cpp
# Opt level: O2

idx_t duckdb::DictionaryCompressionStorage::StringFinalAnalyze(AnalyzeState *state_p)

{
  idx_t iVar1;
  bitpacking_width_t packing_width;
  type pDVar2;
  idx_t iVar3;
  idx_t iVar4;
  ulong uVar5;
  float fVar6;
  
  pDVar2 = unique_ptr<duckdb::DictionaryAnalyzeState,_std::default_delete<duckdb::DictionaryAnalyzeState>,_true>
           ::operator*((unique_ptr<duckdb::DictionaryAnalyzeState,_std::default_delete<duckdb::DictionaryAnalyzeState>,_true>
                        *)(state_p + 1));
  packing_width =
       BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(pDVar2->current_unique_count + 1);
  iVar3 = DictionaryCompression::RequiredSpace
                    (pDVar2->current_tuple_count,pDVar2->current_unique_count,
                     pDVar2->current_dict_size,packing_width);
  iVar1 = pDVar2->segment_count;
  iVar4 = CompressionInfo::GetBlockSize
                    (&(pDVar2->super_DictionaryCompressionState).super_CompressionState.info);
  fVar6 = (float)(iVar4 * iVar1 + iVar3) * 1.2;
  uVar5 = (ulong)fVar6;
  return (long)(fVar6 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
}

Assistant:

idx_t DictionaryCompressionStorage::StringFinalAnalyze(AnalyzeState &state_p) {
	auto &analyze_state = state_p.Cast<DictionaryCompressionAnalyzeState>();
	auto &state = *analyze_state.analyze_state;

	auto width = BitpackingPrimitives::MinimumBitWidth(state.current_unique_count + 1);
	auto req_space = DictionaryCompression::RequiredSpace(state.current_tuple_count, state.current_unique_count,
	                                                      state.current_dict_size, width);

	const auto total_space = state.segment_count * state.info.GetBlockSize() + req_space;
	return LossyNumericCast<idx_t>(DictionaryCompression::MINIMUM_COMPRESSION_RATIO * float(total_space));
}